

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.h
# Opt level: O2

void __thiscall
obs::observers<Observer>::notify_observers<>
          (observers<Observer> *this,offset_in_observer_type_to_subr method)

{
  bool bVar1;
  Observer *pOVar2;
  long *plVar3;
  code *pcVar4;
  long in_RDX;
  iterator __end0;
  iterator __begin0;
  iterator local_70;
  iterator local_48;
  
  safe_list<Observer>::begin(&local_48,&this->m_observers);
  safe_list<Observer>::end(&local_70,&this->m_observers);
  while( true ) {
    bVar1 = safe_list<Observer>::iterator::operator!=(&local_48,&local_70);
    if (!bVar1) break;
    pOVar2 = safe_list<Observer>::iterator::operator*(&local_48);
    if (pOVar2 != (Observer *)0x0) {
      plVar3 = (long *)((long)&pOVar2->_vptr_Observer + in_RDX);
      pcVar4 = (code *)method;
      if ((method & 1) != 0) {
        pcVar4 = *(code **)(*plVar3 + -1 + method);
      }
      (*pcVar4)(plVar3);
    }
    safe_list<Observer>::iterator::operator++(&local_48);
  }
  safe_list<Observer>::iterator::~iterator(&local_70);
  safe_list<Observer>::iterator::~iterator(&local_48);
  return;
}

Assistant:

void notify_observers(void (observer_type::*method)(Args...), Args ...args) {
    for (auto observer : m_observers) {
      if (observer)
        (observer->*method)(std::forward<Args>(args)...);
    }
  }